

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::replace_illegal_names(CompilerHLSL *this)

{
  int iVar1;
  long lVar2;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_e0[0] = local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"line","");
      local_c0[0] = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"linear","");
      local_a0[0] = local_90;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"matrix","");
      local_80[0] = local_70;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"point","");
      local_60[0] = local_50;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"row_major","");
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"sampler","");
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&replace_illegal_names()::keywords_abi_cxx11_,local_e0,&stack0xffffffffffffffe0,
                 0,&local_e1,&local_e2,&local_e3);
      lVar2 = 0;
      do {
        if (local_30 + lVar2 != *(undefined1 **)((long)local_40 + lVar2)) {
          operator_delete(*(undefined1 **)((long)local_40 + lVar2));
        }
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0xc0);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  CompilerGLSL::replace_illegal_names
            (&this->super_CompilerGLSL,&replace_illegal_names()::keywords_abi_cxx11_);
  CompilerGLSL::replace_illegal_names(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerHLSL::replace_illegal_names()
{
	static const unordered_set<string> keywords = {
		// Additional HLSL specific keywords.
		"line", "linear", "matrix", "point", "row_major", "sampler",
	};

	CompilerGLSL::replace_illegal_names(keywords);
	CompilerGLSL::replace_illegal_names();
}